

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O0

void __thiscall
soplex::
SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSimplifier(SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,char *p_name,TYPE ttype)

{
  Timer *pTVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  double in_stack_ffffffffffffff78;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff80;
  TYPE in_stack_ffffffffffffff94;
  undefined8 local_68;
  undefined8 local_60 [4];
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  *in_RDI = &PTR__SPxSimplifier_0089fc50;
  in_RDI[1] = in_RSI;
  in_RDI[2] = 0;
  *(undefined4 *)(in_RDI + 3) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  local_30 = in_RDI + 7;
  local_60[0] = 0;
  local_38 = local_60;
  local_40 = 0;
  local_8 = local_38;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RDI);
  local_18 = in_RDI + 0x17;
  local_68 = 0x3f1a36e2eb1c432d;
  local_20 = &local_68;
  local_28 = 0;
  local_10 = local_20;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RDI);
  in_RDI[0x27] = 0;
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x6f2082);
  pTVar1 = TimerFactory::createTimer(in_stack_ffffffffffffff94);
  in_RDI[2] = pTVar1;
  return;
}

Assistant:

explicit SPxSimplifier(const char* p_name, Timer::TYPE ttype = Timer::USER_TIME)
      : m_name(p_name)
      , m_timeUsed(nullptr)
      , m_timerType(ttype)
      , m_remRows(0)
      , m_remCols(0)
      , m_remNzos(0)
      , m_chgBnds(0)
      , m_chgLRhs(0)
      , m_keptBnds(0)
      , m_keptLRhs(0)
      , m_objoffset(0.0)
      , m_minReduction(1e-4)
      , spxout(nullptr)
   {
      assert(isConsistent());

      m_timeUsed = TimerFactory::createTimer(ttype);
   }